

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::VerifyConstraint
          (ART *this,DataChunk *chunk,IndexAppendInfo *info,ConflictManager *manager)

{
  mutex *__mutex;
  bool bVar1;
  VerifyExistenceType verify_type;
  Allocator *pAVar2;
  unsafe_optional_ptr<const_Node> leaf;
  idx_t row_idx;
  ConstraintException *this_00;
  ulong chunk_index;
  long lVar3;
  _Alloc_hider _Var4;
  optional_idx conflict_idx;
  optional_ptr<duckdb::ART,_true> local_118;
  string key_name;
  unsafe_vector<ARTKey> keys;
  DataChunk expr_chunk;
  string exception_msg;
  ArenaAllocator arena_allocator;
  
  __mutex = &(this->super_BoundIndex).lock;
  ::std::mutex::lock(__mutex);
  DataChunk::DataChunk(&expr_chunk);
  pAVar2 = Allocator::DefaultAllocator();
  DataChunk::Initialize(&expr_chunk,pAVar2,&(this->super_BoundIndex).logical_types,0x800);
  BoundIndex::ExecuteExpressions(&this->super_BoundIndex,chunk,&expr_chunk);
  pAVar2 = BufferAllocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&arena_allocator,pAVar2,0x800);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,expr_chunk.count,
             (allocator_type *)&key_name);
  GenerateKeys<false>(this,&arena_allocator,&expr_chunk,&keys);
  if ((info->delete_index).ptr == (BoundIndex *)0x0) {
    local_118.ptr = (ART *)0x0;
  }
  else {
    local_118.ptr = (ART *)optional_ptr<duckdb::BoundIndex,_true>::operator->(&info->delete_index);
  }
  conflict_idx.index = 0xffffffffffffffff;
  _Var4._M_p = (pointer)0xffffffffffffffff;
  lVar3 = 0;
  chunk_index = 0;
  do {
    if ((_Var4._M_p != (pointer)0xffffffffffffffff) || (chunk->count <= chunk_index)) {
      ConflictManager::FinishLookup(manager);
      if (_Var4._M_p == (pointer)0xffffffffffffffff) {
        ::std::_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::~_Vector_base
                  ((_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> *)&keys);
        ArenaAllocator::~ArenaAllocator(&arena_allocator);
        DataChunk::~DataChunk(&expr_chunk);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return;
      }
      row_idx = optional_idx::GetIndex(&conflict_idx);
      GenerateErrorKeyName_abi_cxx11_(&key_name,this,chunk,row_idx);
      verify_type = ConflictManager::LookupType(manager);
      GenerateConstraintErrorMessage(&exception_msg,this,verify_type,&key_name);
      this_00 = (ConstraintException *)__cxa_allocate_exception(0x10);
      ConstraintException::ConstraintException(this_00,&exception_msg);
      __cxa_throw(this_00,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(long *)((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar3) == 0) {
      bVar1 = ConflictManager::AddNull(manager,chunk_index);
      _Var4._M_p = (pointer)0xffffffffffffffff;
      if (bVar1) {
        optional_idx::optional_idx((optional_idx *)&key_name,chunk_index);
LAB_01a1e524:
        conflict_idx.index = (idx_t)key_name._M_dataplus._M_p;
        _Var4._M_p = key_name._M_dataplus._M_p;
      }
    }
    else {
      leaf = Lookup(this,&this->tree,
                    (ARTKey *)
                    ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                             super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                             _M_impl.super__Vector_impl_data._M_start)->len + lVar3),0);
      if (leaf.ptr == (Node *)0x0) {
        bVar1 = ConflictManager::AddMiss(manager,chunk_index);
        _Var4._M_p = (pointer)0xffffffffffffffff;
        if (bVar1) {
          optional_idx::optional_idx((optional_idx *)&key_name,chunk_index);
          goto LAB_01a1e524;
        }
      }
      else {
        VerifyLeaf(this,leaf.ptr,
                   (ARTKey *)
                   ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar3),local_118,
                   manager,&conflict_idx,chunk_index);
        _Var4._M_p = (pointer)conflict_idx;
      }
    }
    chunk_index = chunk_index + 1;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

void ART::VerifyConstraint(DataChunk &chunk, IndexAppendInfo &info, ConflictManager &manager) {
	// Lock the index during constraint checking.
	lock_guard<mutex> l(lock);

	DataChunk expr_chunk;
	expr_chunk.Initialize(Allocator::DefaultAllocator(), logical_types);
	ExecuteExpressions(chunk, expr_chunk);

	ArenaAllocator arena_allocator(BufferAllocator::Get(db));
	unsafe_vector<ARTKey> keys(expr_chunk.size());
	GenerateKeys<>(arena_allocator, expr_chunk, keys);

	optional_ptr<ART> delete_art;
	if (info.delete_index) {
		delete_art = info.delete_index->Cast<ART>();
	}

	optional_idx conflict_idx;
	for (idx_t i = 0; !conflict_idx.IsValid() && i < chunk.size(); i++) {
		if (keys[i].Empty()) {
			if (manager.AddNull(i)) {
				conflict_idx = i;
			}
			continue;
		}

		auto leaf = Lookup(tree, keys[i], 0);
		if (!leaf) {
			if (manager.AddMiss(i)) {
				conflict_idx = i;
			}
			continue;
		}
		VerifyLeaf(*leaf, keys[i], delete_art, manager, conflict_idx, i);
	}

	manager.FinishLookup();
	if (!conflict_idx.IsValid()) {
		return;
	}

	auto key_name = GenerateErrorKeyName(chunk, conflict_idx.GetIndex());
	auto exception_msg = GenerateConstraintErrorMessage(manager.LookupType(), key_name);
	throw ConstraintException(exception_msg);
}